

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Load_Sfnt_Table(FT_Face face,FT_ULong tag,FT_Long offset,FT_Byte *buffer,
                           FT_ULong *length)

{
  FT_Module_Requester p_Var1;
  FT_Error FVar2;
  undefined8 *puVar3;
  
  FVar2 = 0x23;
  if ((face != (FT_Face)0x0) && ((face->face_flags & 8) != 0)) {
    p_Var1 = ((face->driver->root).clazz)->get_interface;
    FVar2 = 7;
    if (p_Var1 != (FT_Module_Requester)0x0) {
      puVar3 = (undefined8 *)(*p_Var1)(&face->driver->root,"sfnt-table");
      if (puVar3 != (undefined8 *)0x0) {
        FVar2 = (*(code *)*puVar3)(face,tag,offset,buffer,length);
        return FVar2;
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Sfnt_Table( FT_Face    face,
                      FT_ULong   tag,
                      FT_Long    offset,
                      FT_Byte*   buffer,
                      FT_ULong*  length )
  {
    FT_Service_SFNT_Table  service;


    if ( !face || !FT_IS_SFNT( face ) )
      return FT_THROW( Invalid_Face_Handle );

    FT_FACE_FIND_SERVICE( face, service, SFNT_TABLE );
    if ( !service )
      return FT_THROW( Unimplemented_Feature );

    return service->load_table( face, tag, offset, buffer, length );
  }